

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builder.cpp
# Opt level: O1

Error __thiscall asmjit::BaseBuilder::deletePass(BaseBuilder *this,Pass *pass)

{
  uint uVar1;
  ErrorHandler *errorHandler;
  Logger *pLVar2;
  long *plVar3;
  undefined8 uVar4;
  uint32_t uVar5;
  Error err;
  Error EVar6;
  undefined8 message;
  ZoneVector<asmjit::Pass_*> *this_00;
  long lVar7;
  BaseEmitter *this_01;
  bool bVar8;
  ErrorHandler EStack_f8;
  anon_union_32_4_a21e1b61_for_String_0 aStack_f0;
  char acStack_d0 [136];
  ZoneVector<asmjit::Pass_*> *pZStack_48;
  Pass *pass_local;
  
  if ((this->super_BaseEmitter)._code == (CodeHolder *)0x0) {
    EVar6 = 5;
  }
  else if (pass == (Pass *)0x0) {
    EVar6 = 2;
  }
  else {
    pass_local = pass;
    if (pass->_cb != (BaseBuilder *)0x0) {
      if (pass->_cb != this) {
        return 3;
      }
      this_00 = &this->_passes;
      this_01 = (BaseEmitter *)this_00;
      uVar5 = ZoneVector<asmjit::Pass_*>::indexOf(this_00,&pass_local);
      if (uVar5 == 0xffffffff) {
        deletePass();
        if (this_01->_code == (CodeHolder *)0x0) {
          EVar6 = 5;
        }
        else if (*(int *)&this_01[3]._errorHandler == 0) {
          EVar6 = 0;
        }
        else {
          errorHandler = this_01->_errorHandler;
          pZStack_48 = this_00;
          ErrorHandler::ErrorHandler(&EStack_f8);
          EStack_f8._vptr_ErrorHandler = (_func_int **)&PTR__PostponedErrorHandler_001594b0;
          aStack_f0._large.size = 0;
          aStack_f0._0_8_ = 0x20;
          aStack_f0._large.capacity = 0x87;
          aStack_f0._large.data = acStack_d0;
          acStack_d0[0] = '\0';
          BaseEmitter::setErrorHandler(this_01,&EStack_f8);
          uVar1 = *(uint *)&this_01[3]._errorHandler;
          err = 0;
          if ((ulong)uVar1 != 0) {
            pLVar2 = this_01[3]._logger;
            lVar7 = 0;
            do {
              plVar3 = *(long **)((long)&((Logger *)
                                         (&((Logger *)
                                           (&((Logger *)(&pLVar2->_options + -1))->_options + -1))->
                                           _options + -1))->_options + lVar7 + 0xfffffffffffffff8U);
              Zone::reset((Zone *)&this_01[1]._extraReg,0);
              err = (**(code **)(*plVar3 + 0x10))(plVar3,&this_01[1]._extraReg,this_01->_logger);
              if (err != 0) break;
              bVar8 = (ulong)uVar1 * 8 + -8 != lVar7;
              lVar7 = lVar7 + 8;
            } while (bVar8);
          }
          Zone::reset((Zone *)&this_01[1]._extraReg,0);
          BaseEmitter::setErrorHandler(this_01,errorHandler);
          EVar6 = 0;
          if (err != 0) {
            message = aStack_f0._small.data;
            uVar4 = aStack_f0._0_8_ & 0xff;
            if (0x1e < (aStack_f0._0_8_ & 0xff)) {
              message = aStack_f0._large.data;
              uVar4 = aStack_f0._large.size;
            }
            if (uVar4 == 0) {
              message = (char *)0x0;
            }
            EVar6 = BaseEmitter::reportError(this_01,err,(char *)message);
          }
          EStack_f8._vptr_ErrorHandler = (_func_int **)&PTR__PostponedErrorHandler_001594b0;
          String::reset((String *)&aStack_f0._small);
          ErrorHandler::~ErrorHandler(&EStack_f8);
        }
        return EVar6;
      }
      pass_local->_cb = (BaseBuilder *)0x0;
      ZoneVector<asmjit::Pass_*>::removeAt(this_00,(ulong)uVar5);
    }
    deletePass((BaseBuilder *)&pass_local);
    EVar6 = 0;
  }
  return EVar6;
}

Assistant:

ASMJIT_FAVOR_SIZE Error BaseBuilder::deletePass(Pass* pass) noexcept {
  if (ASMJIT_UNLIKELY(!_code))
    return DebugUtils::errored(kErrorNotInitialized);

  if (ASMJIT_UNLIKELY(pass == nullptr))
    return DebugUtils::errored(kErrorInvalidArgument);

  if (pass->_cb != nullptr) {
    if (pass->_cb != this)
      return DebugUtils::errored(kErrorInvalidState);

    uint32_t index = _passes.indexOf(pass);
    ASMJIT_ASSERT(index != Globals::kNotFound);

    pass->_cb = nullptr;
    _passes.removeAt(index);
  }

  pass->~Pass();
  return kErrorOk;
}